

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

void FT_Set_Transform(FT_Face face,FT_Matrix *matrix,FT_Vector *delta)

{
  FT_Face_Internal pFVar1;
  FT_Fixed FVar2;
  FT_Fixed FVar3;
  FT_Fixed FVar4;
  FT_Int FVar5;
  FT_Vector *pFVar6;
  FT_Pos FVar7;
  
  if (face == (FT_Face)0x0) {
    return;
  }
  pFVar1 = face->internal;
  pFVar1->transform_flags = 0;
  if (matrix == (FT_Matrix *)0x0) {
    (pFVar1->transform_matrix).xx = 0x10000;
    (pFVar1->transform_matrix).xy = 0;
    (pFVar1->transform_matrix).yx = 0;
    (pFVar1->transform_matrix).yy = 0x10000;
    matrix = &pFVar1->transform_matrix;
LAB_0013331d:
    if (((((FT_Face_Internal)matrix)->transform_matrix).xx == 0x10000) &&
       ((((FT_Face_Internal)matrix)->transform_matrix).yy == 0x10000)) {
      FVar5 = 2;
      goto LAB_0013333d;
    }
  }
  else {
    FVar2 = matrix->xx;
    FVar3 = matrix->xy;
    FVar4 = matrix->yy;
    (pFVar1->transform_matrix).yx = matrix->yx;
    (pFVar1->transform_matrix).yy = FVar4;
    (pFVar1->transform_matrix).xx = FVar2;
    (pFVar1->transform_matrix).xy = FVar3;
    if (matrix->yx == 0 && matrix->xy == 0) goto LAB_0013331d;
  }
  pFVar1->transform_flags = 1;
  FVar5 = 3;
LAB_0013333d:
  pFVar6 = &pFVar1->transform_delta;
  if (delta == (FT_Vector *)0x0) {
    pFVar6->x = 0;
    (pFVar1->transform_delta).y = 0;
    FVar7 = 0;
  }
  else {
    FVar7 = delta->y;
    pFVar6->x = delta->x;
    (pFVar1->transform_delta).y = FVar7;
    FVar7 = delta->x;
    pFVar6 = delta;
  }
  if (FVar7 != 0 || pFVar6->y != 0) {
    pFVar1->transform_flags = FVar5;
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Set_Transform( FT_Face     face,
                    FT_Matrix*  matrix,
                    FT_Vector*  delta )
  {
    FT_Face_Internal  internal;


    if ( !face )
      return;

    internal = face->internal;

    internal->transform_flags = 0;

    if ( !matrix )
    {
      internal->transform_matrix.xx = 0x10000L;
      internal->transform_matrix.xy = 0;
      internal->transform_matrix.yx = 0;
      internal->transform_matrix.yy = 0x10000L;

      matrix = &internal->transform_matrix;
    }
    else
      internal->transform_matrix = *matrix;

    /* set transform_flags bit flag 0 if `matrix' isn't the identity */
    if ( ( matrix->xy | matrix->yx ) ||
         matrix->xx != 0x10000L      ||
         matrix->yy != 0x10000L      )
      internal->transform_flags |= 1;

    if ( !delta )
    {
      internal->transform_delta.x = 0;
      internal->transform_delta.y = 0;

      delta = &internal->transform_delta;
    }
    else
      internal->transform_delta = *delta;

    /* set transform_flags bit flag 1 if `delta' isn't the null vector */
    if ( delta->x | delta->y )
      internal->transform_flags |= 2;
  }